

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorFactory.cpp
# Opt level: O2

bool __thiscall
OpenMD::IntegratorFactory::registerIntegrator(IntegratorFactory *this,IntegratorCreator *creator)

{
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*>_>,_bool>
  pVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*>
  local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)&creator->ident_);
  local_40.second = creator;
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::IntegratorCreator*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::IntegratorCreator*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::IntegratorCreator*>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::IntegratorCreator*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::IntegratorCreator*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::IntegratorCreator*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::IntegratorCreator*>>>
                      *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return (bool)(pVar1.second & 1);
}

Assistant:

bool IntegratorFactory::registerIntegrator(IntegratorCreator* creator) {
    return creatorMap_
        .insert(CreatorMapType::value_type(creator->getIdent(), creator))
        .second;
  }